

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button_commands.cpp
# Opt level: O3

Am_Wrapper * check_accel_string_proc(Am_Object *self)

{
  bool bVar1;
  bool bVar2;
  Am_Value *pAVar3;
  char *s_00;
  Am_Wrapper *pAVar4;
  Am_Input_Char local_dc;
  Am_String sval;
  Am_Object old_cmd_window;
  Am_Object old_cmd_obj;
  Am_Object cmd_obj;
  Am_Value cmd_value;
  Am_Value accel_value;
  Am_Object local_98;
  Am_Object local_90;
  Am_String local_88;
  Am_Object local_80;
  Am_Object local_78;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50;
  char s [38];
  
  cmd_value.type = 0;
  cmd_value.value.wrapper_value = (Am_Wrapper *)0x0;
  cmd_obj.data = (Am_Object_Data *)0x0;
  old_cmd_obj.data = (Am_Object_Data *)0x0;
  old_cmd_window.data = (Am_Object_Data *)0x0;
  pAVar3 = Am_Object::Get(self,0x1e3,5);
  Am_Value::operator=(&cmd_value,pAVar3);
  bVar1 = Am_Value::Valid(&cmd_value);
  if (bVar1) {
    Am_Object::operator=(&old_cmd_obj,&cmd_value);
  }
  pAVar3 = Am_Object::Get(self,0x1e2,5);
  Am_Value::operator=(&cmd_value,pAVar3);
  bVar1 = Am_Value::Valid(&cmd_value);
  if (bVar1) {
    Am_Object::operator=(&old_cmd_window,&cmd_value);
  }
  pAVar3 = Am_Object::Get(self,0xc5,1);
  Am_Value::operator=(&cmd_value,pAVar3);
  bVar1 = Am_Value::Valid(&cmd_value);
  if (bVar1 && cmd_value.type == 0xa001) {
    Am_Object::operator=(&cmd_obj,&cmd_value);
    Am_Object::Am_Object(&local_50,&Am_Command);
    bVar1 = Am_Object::Is_Instance_Of(&cmd_obj,&local_50);
    Am_Object::~Am_Object(&local_50);
    if (bVar1) {
      pAVar3 = Am_Object::Get(self,0xcc,1);
      bVar1 = Am_Value::Valid(pAVar3);
      bVar2 = false;
      if (bVar1) {
        pAVar3 = Am_Object::Get(self,0x17d,1);
        bVar2 = Am_Value::Valid(pAVar3);
      }
      accel_value.type = 0;
      accel_value.value.wrapper_value = (Am_Wrapper *)0x0;
      Am_Input_Char::Am_Input_Char(&local_dc,0,false,false,false,Am_NEITHER,Am_NOT_MOUSE,false);
      pAVar3 = Am_Object::Get(&cmd_obj,0x152,1);
      Am_Value::operator=(&accel_value,pAVar3);
      if (accel_value.type == Am_Input_Char::Am_Input_Char_ID) {
        local_dc.code = (short)accel_value.value.long_value;
        local_dc._2_2_ =
             (ushort)((ulong)accel_value.value >> 0x10) & 0xfff | local_dc._2_2_ & 0xf000;
      }
      else if (accel_value.type == 0x8008) {
        sval.data = (Am_String_Data *)0x0;
        Am_String::operator=(&sval,&accel_value);
        s_00 = Am_String::operator_cast_to_char_(&sval);
        Am_Input_Char::Am_Input_Char((Am_Input_Char *)s,s_00,true);
        local_dc.code._0_1_ = s[0];
        local_dc.code._1_1_ = s[1];
        local_dc._2_2_ = s._2_2_ & 0xfff | local_dc._2_2_ & 0xf000;
        Am_Input_Char::operator_cast_to_Am_Value(&local_dc);
        Am_Object::Set(&cmd_obj,0x152,(Am_Value *)s,0);
        Am_Value::~Am_Value((Am_Value *)s);
        Am_String::~Am_String(&sval);
      }
      if (local_dc.code != 0) {
        Am_Input_Char::As_Short_String(&local_dc,s);
        get_window((Am_Object *)&sval);
        bVar1 = Am_Object::operator!=(&old_cmd_obj,&cmd_obj);
        if (bVar1) {
LAB_0022f3b0:
          bVar1 = Am_Object::Valid(&old_cmd_obj);
          if (bVar1) {
            bVar1 = Am_Object::Valid(&old_cmd_window);
            if (bVar1) {
              Am_Object::Am_Object(&local_58,&old_cmd_obj);
              Am_Object::Am_Object(&local_60,&old_cmd_window);
              Am_Remove_Accelerator_Command_From_Window(&local_58,&local_60);
              Am_Object::~Am_Object(&local_60);
              Am_Object::~Am_Object(&local_58);
            }
          }
          bVar1 = Am_Object::Valid((Am_Object *)&sval);
          if ((bVar2 & bVar1) == 1) {
            Am_Object::Am_Object(&local_68,&cmd_obj);
            Am_Object::Am_Object(&local_70,(Am_Object *)&sval);
            Am_Add_Accelerator_Command_To_Window(&local_68,&local_70);
            Am_Object::~Am_Object(&local_70);
            Am_Object::~Am_Object(&local_68);
            pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&cmd_obj);
            Am_Object::Set(self,0x1e3,pAVar4,1);
            pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&sval);
            Am_Object::Set(self,0x1e2,pAVar4,1);
          }
          else {
LAB_0022f60b:
            Am_Object::Set(self,0x1e3,0,1);
            Am_Object::Set(self,0x1e2,0,1);
          }
        }
        else {
          bVar1 = Am_Object::operator!=(&old_cmd_window,(Am_Object *)&sval);
          if (bVar1) goto LAB_0022f3b0;
          if (bVar2 == false) {
            bVar1 = Am_Object::Valid(&old_cmd_obj);
            if (!bVar1) goto LAB_0022f633;
            bVar1 = Am_Object::Valid(&old_cmd_window);
            if (!bVar1) goto LAB_0022f633;
            bVar1 = Am_Object::Valid((Am_Object *)&sval);
            if (bVar1) {
              Am_Object::Am_Object(&local_78,&old_cmd_obj);
              Am_Object::Am_Object(&local_80,&old_cmd_window);
              Am_Remove_Accelerator_Command_From_Window(&local_78,&local_80);
              Am_Object::~Am_Object(&local_80);
              Am_Object::~Am_Object(&local_78);
            }
            goto LAB_0022f60b;
          }
        }
LAB_0022f633:
        Am_String::Am_String(&local_88,s,true);
        pAVar4 = Am_String::operator_cast_to_Am_Wrapper_(&local_88);
        Am_String::~Am_String(&local_88);
        Am_Object::~Am_Object((Am_Object *)&sval);
        Am_Value::~Am_Value(&accel_value);
        goto LAB_0022f55a;
      }
      Am_Value::~Am_Value(&accel_value);
    }
  }
  bVar1 = Am_Object::Valid(&old_cmd_obj);
  if (bVar1) {
    bVar1 = Am_Object::Valid(&old_cmd_window);
    if (bVar1) {
      Am_Object::Am_Object(&local_90,&old_cmd_obj);
      Am_Object::Am_Object(&local_98,&old_cmd_window);
      Am_Remove_Accelerator_Command_From_Window(&local_90,&local_98);
      Am_Object::~Am_Object(&local_98);
      Am_Object::~Am_Object(&local_90);
      Am_Object::Set(self,0x1e3,0,1);
      pAVar4 = (Am_Wrapper *)0x0;
      Am_Object::Set(self,0x1e2,0,1);
      goto LAB_0022f55a;
    }
  }
  pAVar4 = (Am_Wrapper *)0x0;
LAB_0022f55a:
  Am_Object::~Am_Object(&old_cmd_window);
  Am_Object::~Am_Object(&old_cmd_obj);
  Am_Object::~Am_Object(&cmd_obj);
  Am_Value::~Am_Value(&cmd_value);
  return pAVar4;
}

Assistant:

Am_Define_String_Formula(check_accel_string)
{
  Am_Value cmd_value;
  Am_Object cmd_obj, old_cmd_obj, old_cmd_window;
  cmd_value = self.Peek(Am_ACCELERATOR_LIST, Am_NO_DEPENDENCY);
  if (cmd_value.Valid())
    old_cmd_obj = cmd_value;
  cmd_value = self.Peek(Am_ACCELERATOR_INTER, Am_NO_DEPENDENCY);
  if (cmd_value.Valid())
    old_cmd_window = cmd_value;
  cmd_value = self.Peek(Am_COMMAND);
  if (cmd_value.Valid() && cmd_value.type == Am_OBJECT) {
    cmd_obj = cmd_value;
    if (cmd_obj.Is_Instance_Of(Am_Command)) {
      // False,no? --ortalo
      bool cmd_active =
          self.Peek(Am_ACTIVE).Valid() && self.Peek(Am_ACTIVE_2).Valid();
      Am_Value accel_value;
      Am_Input_Char accel_char;
      accel_value = cmd_obj.Peek(Am_ACCELERATOR);
      if (Am_Input_Char::Test(accel_value))
        accel_char = accel_value;
      else if (accel_value.type == Am_STRING) {
        // convert string into right type
        Am_String sval;
        sval = accel_value;
        accel_char = Am_Input_Char((const char *)sval);
        // store it back into the slot so more efficient next time
        // (because no parsing will be needed next time)
        cmd_obj.Set(Am_ACCELERATOR, accel_char);
      }
      //      std::cout << "@@Widget " << self << " command " << cmd_obj
      //		<< " active " << cmd_active
      //		<< " label = " << self.Get(Am_REAL_STRING_OR_OBJ)
      //		<< " accel " << accel_char << std::endl << std::flush;
      // now do comparison
      if (accel_char.Valid()) { //then is a legal accelerator character
        char s[Am_LONGEST_CHAR_STRING];
        accel_char.As_Short_String(s);
        Am_Object window = get_window(self);

        if ((old_cmd_obj != cmd_obj || old_cmd_window != window)) {
          if (old_cmd_obj.Valid() && old_cmd_window.Valid())
            Am_Remove_Accelerator_Command_From_Window(old_cmd_obj,
                                                      old_cmd_window);
          if (window.Valid() && cmd_active) {
            Am_Add_Accelerator_Command_To_Window(cmd_obj, window);
            self.Set(Am_ACCELERATOR_LIST, cmd_obj, Am_OK_IF_NOT_THERE);
            self.Set(Am_ACCELERATOR_INTER, window, Am_OK_IF_NOT_THERE);
          } else {
            self.Set(Am_ACCELERATOR_LIST, (0L), Am_OK_IF_NOT_THERE);
            self.Set(Am_ACCELERATOR_INTER, (0L), Am_OK_IF_NOT_THERE);
          }
        } else if (!cmd_active && old_cmd_obj.Valid() &&
                   old_cmd_window.Valid()) {
          if (window.Valid())
            Am_Remove_Accelerator_Command_From_Window(old_cmd_obj,
                                                      old_cmd_window);
          self.Set(Am_ACCELERATOR_LIST, (0L), Am_OK_IF_NOT_THERE);
          self.Set(Am_ACCELERATOR_INTER, (0L), Am_OK_IF_NOT_THERE);
        }
        //std::cout << "Returning str=" << Am_String(s) <<std::endl <<std::flush;
        return Am_String(s);
      }
    }
  }
  if (old_cmd_obj.Valid() && old_cmd_window.Valid()) {
    Am_Remove_Accelerator_Command_From_Window(old_cmd_obj, old_cmd_window);
    self.Set(Am_ACCELERATOR_LIST, (0L), Am_OK_IF_NOT_THERE);
    self.Set(Am_ACCELERATOR_INTER, (0L), Am_OK_IF_NOT_THERE);
  }

  // no accel string
  return nullptr;
}